

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

char * __thiscall
stringsearch<boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>
::search(stringsearch<boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>
         *this,char *first,char *last,CallbackType *cb)

{
  boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>> *pbVar1;
  long lVar2;
  bool bVar3;
  tuple<unsigned_long,_boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>
  *hp;
  boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>> *this_00;
  char *pcVar4;
  pair<const_char_*,_const_char_*> pVar5;
  
  this_00 = (boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>> *)
            (this->patterns).
            super__Vector_base<std::tuple<unsigned_long,_boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>,_std::allocator<std::tuple<unsigned_long,_boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>> *)
           (this->patterns).
           super__Vector_base<std::tuple<unsigned_long,_boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>,_std::allocator<std::tuple<unsigned_long,_boost::algorithm::boyer_moore_horspool<const_char_*,_boost::algorithm::detail::BM_traits<const_char_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pbVar1) {
      return last;
    }
    lVar2 = *(long *)(this_00 + 0x820);
    pcVar4 = first;
    while (pcVar4 != last) {
      pVar5 = boost::algorithm::
              boyer_moore_horspool<char_const*,boost::algorithm::detail::BM_traits<char_const*>>::
              operator()(this_00,pcVar4,last);
      pcVar4 = pVar5.first;
      if (pcVar4 == last) break;
      bVar3 = std::function<bool_(const_char_*,_const_char_*)>::operator()(cb,pcVar4,pcVar4 + lVar2)
      ;
      pcVar4 = pcVar4 + 1;
      if (!bVar3) {
        return (char *)0x0;
      }
    }
    this_00 = this_00 + 0x828;
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& hp : patterns)
        {
            auto size = std::get<0>(hp);
            auto & searcher = std::get<1>(hp);

            auto p = first;
            while (p != last) {
                auto f = std::search(p, last, searcher);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }